

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

word * Gia_SimRsbFunc(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins,int fOnSet)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  int *piVar4;
  word *pwVar5;
  ulong uVar6;
  word *pwVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  word *pFanins [16];
  long local_a8 [16];
  
  uVar1 = vFanins->nSize;
  iVar9 = 1 << ((char)uVar1 - 6U & 0x1f);
  if ((int)uVar1 < 7) {
    iVar9 = 1;
  }
  pwVar7 = (word *)calloc((long)iVar9,8);
  iVar9 = p->nWords;
  uVar11 = iObj * iVar9;
  if (-1 < (int)uVar11) {
    uVar2 = p->vSimsObj->nSize;
    if ((int)uVar11 < (int)uVar2) {
      pwVar3 = p->vSimsObj->pArray;
      local_a8[0xe] = 0;
      local_a8[0xf] = 0;
      local_a8[0xc] = 0;
      local_a8[0xd] = 0;
      local_a8[10] = 0;
      local_a8[0xb] = 0;
      local_a8[8] = 0;
      local_a8[9] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      if (0x10 < (int)uVar1) {
        __assert_fail("Vec_IntSize(vFanins) <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x1cf,"word *Gia_SimRsbFunc(Gia_SimRsbMan_t *, int, Vec_Int_t *, int)");
      }
      if (0 < (int)uVar1) {
        piVar4 = vFanins->pArray;
        uVar13 = 0;
        do {
          uVar14 = piVar4[uVar13] * iVar9;
          if (((int)uVar14 < 0) || (uVar2 <= uVar14)) goto LAB_007c2d57;
          local_a8[uVar13] = (long)(pwVar3 + uVar14);
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      if (0 < iVar9) {
        pwVar5 = p->pFunc[2];
        uVar2 = iVar9 * 0x40;
        if (iVar9 * 0x40 < 2) {
          uVar2 = 1;
        }
        uVar13 = 0;
        do {
          uVar6 = uVar13 >> 6;
          uVar14 = (uint)uVar13 & 0x3f;
          if (((pwVar5[uVar6] >> (uVar13 & 0x3f) & 1) != 0) &&
             ((uint)((pwVar3[uVar11 + uVar6] >> uVar14 & 1) != 0) == fOnSet)) {
            if ((int)uVar1 < 1) {
              uVar10 = 0;
            }
            else {
              uVar8 = 0;
              uVar10 = 0;
              do {
                uVar12 = 1 << ((byte)uVar8 & 0x1f);
                if ((*(ulong *)(local_a8[uVar8] + uVar6 * 8) & 1L << (sbyte)uVar14) == 0) {
                  uVar12 = 0;
                }
                uVar10 = uVar10 | uVar12;
                uVar8 = uVar8 + 1;
              } while (uVar1 != uVar8);
            }
            pwVar7[(int)uVar10 >> 6] = pwVar7[(int)uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3f);
          }
          uVar14 = (uint)uVar13 + 1;
          uVar13 = (ulong)uVar14;
        } while (uVar14 != uVar2);
      }
      return pwVar7;
    }
  }
LAB_007c2d57:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

word * Gia_SimRsbFunc( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins, int fOnSet )
{
    int nTruthWords = Abc_Truth6WordNum( Vec_IntSize(vFanins) );
    word * pTruth   = ABC_CALLOC( word, nTruthWords ); 
    word * pFunc    = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    word * pFanins[16] = {NULL};  int s, b, iMint, i, iFanin;
    assert( Vec_IntSize(vFanins) <= 16 );
    Vec_IntForEachEntry( vFanins, iFanin, i )
        pFanins[i] = Vec_WrdEntryP( p->vSimsObj, p->nWords*iFanin );
    for ( s = 0; s < 64*p->nWords; s++ )
    {
        if ( !Abc_TtGetBit(p->pFunc[2], s) || Abc_TtGetBit(pFunc, s) != fOnSet )
            continue;
        iMint = 0;
        for ( b = 0; b < Vec_IntSize(vFanins); b++ )
            if ( Abc_TtGetBit(pFanins[b], s) )
                iMint |= 1 << b;
        Abc_TtSetBit( pTruth, iMint );
    }
    return pTruth;
}